

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall Server::~Server(Server *this)

{
  Terminate(this);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Server::~Server()
{
    Terminate();
}